

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::FunctionTypename::FunctionTypename
          (FunctionTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *returnTypename,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *argumentTypenames)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  pointer pTVar5;
  undefined4 extraout_var_00;
  string local_208 [32];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *local_1e8;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *__range1;
  string separator;
  bool wrap;
  ostringstream local_198 [8];
  ostringstream name;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *argumentTypenames_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *returnTypename_local;
  FunctionTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__FunctionTypename_0016a9d0;
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->m_returnTypename,returnTypename);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::vector(&this->m_argumentTypenames,argumentTypenames);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::ostringstream::ostringstream(local_198);
  sVar3 = std::
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          ::size(argumentTypenames);
  separator.field_2._M_local_buf[0xb] = sVar3 != 1;
  if ((bool)separator.field_2._M_local_buf[0xb]) {
    std::operator<<((ostream *)local_198,'(');
  }
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ::begin(&this->m_argumentTypenames);
  typename_ = (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
              std::
              vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              ::end(&this->m_argumentTypenames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                                *)&typename_);
    if (!bVar1) break;
    local_1e8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                ::operator*(&__end1);
    std::operator<<((ostream *)local_198,(string *)&__range1);
    pTVar5 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(local_1e8);
    iVar2 = (*pTVar5->_vptr_Typename[4])();
    std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::operator=((string *)&__range1,", ");
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((separator.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::operator<<((ostream *)local_198,')');
  }
  poVar4 = std::operator<<((ostream *)local_198," => ");
  pTVar5 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&this->m_returnTypename);
  iVar2 = (*pTVar5->_vptr_Typename[4])();
  std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_name,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

FunctionTypename::FunctionTypename(std::unique_ptr<const Typename> returnTypename,
                                       std::vector<std::unique_ptr<const Typename>> argumentTypenames) :
            m_returnTypename{std::move(returnTypename)},
            m_argumentTypenames{std::move(argumentTypenames)} {
        std::ostringstream name{};

        const bool wrap = argumentTypenames.size() != 1;

        if (wrap) name << '(';

        std::string separator{};
        for (const auto& typename_ : m_argumentTypenames) {
            name << separator;
            name << typename_->name();
            separator = ", ";
        }

        if (wrap) name << ')';
        name << " => " << m_returnTypename->name();

        m_name = name.str();
    }